

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetISRFunc(uint gpio,uint edge,int timeout,gpioISRFunc_t f)

{
  FILE *pFVar1;
  char *pcVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  uint in_EDI;
  void *in_stack_00000088;
  int in_stack_00000094;
  void *in_stack_00000098;
  int in_stack_000000a0;
  uint in_stack_000000a4;
  uint in_stack_000000a8;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d edge=%d timeout=%d function=%08X\n",pcVar2,"gpioSetISRFunc",
            (ulong)in_EDI,(ulong)in_ESI,in_EDX,in_ECX);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioSetISRFunc")
      ;
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x36) {
    if (in_ESI < 3) {
      local_4 = intGpioSetISRFunc(in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,
                                  in_stack_00000098,in_stack_00000094,in_stack_00000088);
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: bad ISR edge (%d)\n",pcVar2,"gpioSetISRFunc",(ulong)in_ESI);
      }
      local_4 = -0x7a;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad gpio (%d)\n",pcVar2,"gpioSetISRFunc",(ulong)in_EDI);
    }
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int gpioSetISRFunc(
   unsigned gpio,
   unsigned edge,
   int timeout,
   gpioISRFunc_t f)
{
   DBG(DBG_USER, "gpio=%d edge=%d timeout=%d function=%08X",
      gpio, edge, timeout, (uint32_t)f);

   CHECK_INITED;

   if (gpio > PI_MAX_GPIO)
      SOFT_ERROR(PI_BAD_GPIO, "bad gpio (%d)", gpio);

   if (edge > EITHER_EDGE)
      SOFT_ERROR(PI_BAD_EDGE, "bad ISR edge (%d)", edge);

   return intGpioSetISRFunc(gpio, edge, timeout, f, 0, NULL);
}